

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeclaredType.cpp
# Opt level: O2

bool slang::ast::isValidForIfaceVar(Type *type)

{
  SyntaxNode *pSVar1;
  bool bVar2;
  bool bVar3;
  Type *pTVar4;
  Type *type_00;
  long lVar5;
  
  while( true ) {
    pTVar4 = Type::getCanonicalType(type);
    bVar2 = Type::isVirtualInterface(pTVar4);
    if (bVar2) {
      return false;
    }
    bVar2 = Type::isUnpackedArray(pTVar4);
    if (!bVar2) break;
    type = Type::getArrayElementType(pTVar4);
  }
  bVar2 = Type::isUnpackedStruct(pTVar4);
  if (bVar2) {
    pSVar1 = pTVar4[1].super_Symbol.originatingSyntax;
    pTVar4 = pTVar4[1].canonical;
    lVar5 = 0;
    do {
      bVar2 = (long)pTVar4 << 3 == lVar5;
      if (bVar2) {
        return bVar2;
      }
      type_00 = DeclaredType::getType
                          ((DeclaredType *)(*(long *)((long)&pSVar1->kind + lVar5) + 0x40));
      bVar3 = isValidForIfaceVar(type_00);
      lVar5 = lVar5 + 8;
    } while (bVar3);
    return bVar2;
  }
  return true;
}

Assistant:

static bool isValidForIfaceVar(const Type& type) {
    auto& ct = type.getCanonicalType();
    if (ct.isVirtualInterface())
        return false;

    if (ct.isUnpackedArray())
        return isValidForIfaceVar(*ct.getArrayElementType());

    if (ct.isUnpackedStruct()) {
        for (auto field : ct.as<UnpackedStructType>().fields) {
            if (!isValidForIfaceVar(field->getType()))
                return false;
        }
    }

    return true;
}